

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O3

void __thiscall
TeamCityTestOutput::printCurrentTestStarted(TeamCityTestOutput *this,UtestShell *test)

{
  int iVar1;
  char *pcVar2;
  
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])
            (this,"##teamcity[testStarted name=\'");
  UtestShell::getName((UtestShell *)&stack0xffffffffffffffe0);
  pcVar2 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffe0);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,pcVar2);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffe0);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\']\n");
  iVar1 = (*test->_vptr_UtestShell[6])(test);
  if ((char)iVar1 == '\0') {
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])
              (this,"##teamcity[testIgnored name=\'");
    UtestShell::getName((UtestShell *)&stack0xffffffffffffffe0);
    pcVar2 = SimpleString::asCharString((SimpleString *)&stack0xffffffffffffffe0);
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,pcVar2);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffe0);
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\']\n");
  }
  this->currtest_ = test;
  return;
}

Assistant:

void TeamCityTestOutput::printCurrentTestStarted(const UtestShell& test)
{
    print("##teamcity[testStarted name='");
    print(test.getName().asCharString());
    print("']\n");
    if (!test.willRun()) {
        print("##teamcity[testIgnored name='");
        print(test.getName().asCharString());
        print("']\n");
    }
    currtest_ = &test;
}